

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Base.cpp
# Opt level: O2

void __thiscall mbc::Val::ValBase::~ValBase(ValBase *this)

{
  int *piVar1;
  string *this_00;
  
  this->_vptr_ValBase = (_func_int **)&PTR__ValBase_0013e6c0;
  piVar1 = this->count_;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  operator_delete(piVar1);
  this_00 = this->invaild_waring_;
  if (this_00 != (string *)0x0) {
    std::__cxx11::string::~string((string *)this_00);
  }
  operator_delete(this_00);
  operator_delete(this->is_vaild_);
  operator_delete(this->type_);
  return;
}

Assistant:

ValBase::~ValBase() {
    -- *count_;
    if(*count_ == 0) {
        delete count_;
        delete invaild_waring_;
        delete is_vaild_;
        delete type_;
    }
}